

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jit.c
# Opt level: O3

int ravi_jitenable(lua_State *L)

{
  int iVar1;
  int iVar2;
  
  iVar1 = lua_gettop(L);
  iVar2 = raviV_getjitenabled(L);
  if (iVar1 == 1) {
    iVar1 = lua_toboolean(L,1);
    raviV_setjitenabled(L,iVar1);
  }
  lua_pushboolean(L,(uint)(iVar2 != 0));
  return 1;
}

Assistant:

static int ravi_jitenable(lua_State *L) {
  int n = lua_gettop(L);
  int oldvalue = raviV_getjitenabled(L);
  if (n == 1) {
    int value = lua_toboolean(L, 1);
    raviV_setjitenabled(L, value);
  }
  lua_pushboolean(L, oldvalue != 0);
  return 1;
}